

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int Init12Video(void)

{
  ushort uVar1;
  SDL20_AllocFormat_t p_Var2;
  Uint16 maxh;
  Uint16 maxw;
  uint uVar3;
  int iVar4;
  SDL_bool SVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  SDL_PixelFormatEnum SVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  VideoModeList *pVVar13;
  SDL12_Rect **ppSVar14;
  long lVar15;
  SDL_bool SVar16;
  int iVar17;
  int in_ESI;
  char *name;
  ulong uVar18;
  ushort uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  VideoModeList *local_90;
  SDL_DisplayMode mode;
  SDL12_Rect local_68;
  char *local_60;
  ulong local_58;
  int local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  uint h;
  
  pcVar10 = (*SDL20_GetCurrentVideoDriver)();
  name = "SDL12COMPAT_SCALE_METHOD";
  pcVar11 = (*SDL20_getenv)("SDL12COMPAT_SCALE_METHOD");
  uVar3 = SDL12Compat_GetHintInt(name,in_ESI);
  AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS",SDL_TRUE);
  AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS",SDL_TRUE);
  SVar16 = SDL_FALSE;
  SVar5 = SDL_FALSE;
  if (pcVar11 != (char *)0x0) {
    iVar4 = (*SDL20_strcmp)(pcVar11,"nearest");
    SVar5 = (SDL_bool)(iVar4 == 0);
  }
  WantScaleMethodNearest = SVar5;
  TranslateKeyboardLayout =
       SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT",TranslateKeyboardLayout);
  if (pcVar10 != (char *)0x0) {
    iVar4 = (*SDL20_strcmp)(pcVar10,"dummy");
    SVar16 = (SDL_bool)(iVar4 == 0);
  }
  IsDummyVideo = SVar16;
  EventQueueMutex = (*SDL20_CreateMutex)();
  iVar4 = -1;
  if (EventQueueMutex != (SDL_mutex *)0x0) {
    lVar12 = 0x7f;
    lVar15 = 0x12a168;
    while (bVar20 = lVar12 != 0, lVar12 = lVar12 + -1, bVar20) {
      *(long *)(lVar15 + -8) = lVar15;
      lVar15 = lVar15 + 0xe8;
    }
    EventQueuePool[0x7f].next = (EventQueueType *)0x0;
    EventQueueTail = (EventQueueType *)0x0;
    EventQueueHead = (EventQueueType *)0x0;
    EventQueueAvailable = EventQueuePool;
    (*SDL20_memset)(&PendingKeydownEvent,0,0x18);
    (*SDL20_memset)(EventStates,1,0x20);
    EventStates[0xd] = '\0';
    (*SDL20_EventState)(0x201,0);
    iVar4 = (*SDL20_strcmp)(pcVar10,"x11");
    SupportSysWM = (SDL_bool)(iVar4 == 0);
    SVar5 = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM",SDL_TRUE);
    if (SVar5 == SDL_FALSE) {
      SupportSysWM = SDL_FALSE;
    }
    KeyRepeatNextTicks = 0;
    KeyRepeatDelay = 0;
    KeyRepeatEvent.type = '\0';
    KeyRepeatInterval = 0;
    iVar4 = 0;
    (*SDL20_DelEventWatch)(EventFilter20to12,(void *)0x0);
    iVar17 = 0;
    (*SDL20_AddEventWatch)(EventFilter20to12,(void *)0x0);
    pcVar11 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_DISPLAY");
    if ((pcVar11 != (char *)0x0) ||
       (pcVar11 = (*SDL20_getenv)("SDL_VIDEO_FULLSCREEN_HEAD"), pcVar11 != (char *)0x0)) {
      iVar17 = 0;
      lVar12 = (*SDL20_strtol)(pcVar11,(char **)0x0,10);
      if ((-1 < (int)lVar12) && (iVar6 = (*SDL20_GetNumVideoDisplays)(), (int)lVar12 < iVar6)) {
        iVar17 = 0;
        lVar12 = (*SDL20_strtol)(pcVar11,(char **)0x0,10);
        iVar4 = (int)lVar12;
      }
    }
    SwapInterval = 0;
    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    VideoDisplayIndex = iVar4;
    (*SDL20_ShowCursor)(1);
    pcVar11 = (char *)(ulong)(uint)VideoDisplayIndex;
    iVar4 = (*SDL20_GetNumDisplayModes)(VideoDisplayIndex);
    uVar7 = SDL12Compat_GetHintInt(pcVar11,iVar17);
    local_68.x = 0;
    local_68.y = 0;
    local_68.w = 0;
    local_68.h = 0;
    SVar5 = SDL12Compat_GetHintBoolean("SDL12COMPAT_OPENGL_SCALING",SDL_TRUE);
    if (VideoModesCount < 1) {
      local_4c = uVar7;
      PreserveDestinationAlpha =
           SDL12Compat_GetHintBoolean("SDL12COMPAT_PRESERVE_DEST_ALPHA",SDL_TRUE);
      WantOpenGLScaling = SVar5;
      pcVar11 = (*SDL20_getenv)("SDL12COMPAT_MAX_VIDMODE");
      iVar17 = 0;
      if (pcVar11 == (char *)0x0) {
        local_40 = 0;
        local_48 = 0;
      }
      else {
        mode.format = 0;
        h = 0;
        SDL_sscanf(pcVar11,"%ux%u",&mode,&h);
        uVar7 = mode.format;
        if (0xfffe < mode.format) {
          uVar7 = 0xffff;
        }
        local_40 = (ulong)uVar7;
        uVar7 = 0xffff;
        if (h < 0xffff) {
          uVar7 = h;
        }
        local_48 = (ulong)uVar7;
      }
      local_50 = iVar4;
      if (iVar4 < 1) {
        local_50 = iVar17;
      }
      local_58 = 0;
      uVar19 = 0;
      local_90 = (VideoModeList *)0x0;
      local_60 = pcVar10;
      iVar4 = local_50;
      while( true ) {
        maxw = (Uint16)local_40;
        maxh = (Uint16)local_48;
        if (iVar17 == iVar4) break;
        iVar6 = (*SDL20_GetDisplayMode)(VideoDisplayIndex,iVar17,&mode);
        if (-1 < iVar6) {
          uVar7 = CONCAT22(mode.w._2_2_,(ushort)mode.w);
          uVar8 = CONCAT22(mode.h._2_2_,(ushort)mode.h);
          if (uVar8 == 0 && uVar7 == 0) {
            if ((IsDummyVideo == SDL_FALSE) || (0x7df < LinkedSDL2VersionInt)) goto LAB_0010751b;
            mode.h._0_2_ = 0x300;
            mode.h._2_2_ = 0;
            mode.format = 0x16161804;
            mode.w._0_2_ = 0x400;
            mode.w._2_2_ = 0;
            uVar7 = 0x400;
            uVar8 = 0x300;
          }
          if ((0 < (int)uVar8 && 0 < (int)uVar7) && (uVar8 < 0x10000 && uVar7 < 0x10000)) {
            if (local_4c < (mode.format >> 8 & 0xff)) {
              mode.format = BPPToPixelFormat(local_4c);
            }
            if ((local_90 == (VideoModeList *)0x0) || (mode.format != local_90->format)) {
              pVVar13 = (VideoModeList *)
                        (*SDL20_realloc)(VideoModes,(long)VideoModesCount * 0x18 + 0x18);
              if (pVVar13 != (VideoModeList *)0x0) {
                lVar12 = (long)VideoModesCount;
                local_90 = pVVar13 + lVar12;
                VideoModes = pVVar13;
                pVVar13[lVar12].format = mode.format;
                VideoModesCount = VideoModesCount + 1;
                *(undefined8 *)&pVVar13[lVar12].nummodes = 0;
                *(undefined8 *)(&pVVar13[lVar12].nummodes + 2) = 0;
                *(undefined4 *)((long)&pVVar13[lVar12].modes12 + 4) = 0;
                goto LAB_0010746d;
              }
            }
            else {
LAB_0010746d:
              auVar21._2_2_ = mode.w._2_2_;
              auVar21._0_2_ = (ushort)mode.w;
              auVar21._4_2_ = (ushort)mode.h;
              auVar21._6_2_ = mode.h._2_2_;
              auVar21._8_8_ = 0;
              auVar21 = pshuflw(auVar21,auVar21,0xe8);
              local_68.w = (short)auVar21._0_4_;
              local_68.h = (short)((uint)auVar21._0_4_ >> 0x10);
              if (SVar5 != SDL_FALSE) {
                for (lVar12 = 0; lVar12 != 0xe8; lVar12 = lVar12 + 8) {
                  uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar12);
                  if ((uVar1 < uVar19) ||
                     ((uVar1 <= uVar19 &&
                      (*(ushort *)((long)&fake_modes[0].h + lVar12) < (ushort)local_58)))) {
                    if (((local_68.w < uVar1) ||
                        ((local_68.w <= uVar1 &&
                         (local_68.h < *(ushort *)((long)&fake_modes[0].h + lVar12))))) &&
                       (iVar4 = AddVidModeToList(local_90,(SDL12_Rect *)
                                                          ((long)&fake_modes[0].x + lVar12),maxw,
                                                 maxh), iVar4 != 0)) goto LAB_00107575;
                  }
                }
              }
              iVar4 = AddVidModeToList(local_90,&local_68,maxw,maxh);
              if (iVar4 == 0) {
                local_58 = (ulong)(ushort)mode.h;
                iVar4 = local_50;
                uVar19 = (ushort)mode.w;
                goto LAB_0010751b;
              }
            }
LAB_00107575:
            iVar4 = (*SDL20_Error)(SDL_ENOMEM);
            pcVar10 = local_60;
            goto LAB_00107615;
          }
        }
LAB_0010751b:
        iVar17 = iVar17 + 1;
      }
      if (SVar5 != SDL_FALSE) {
        for (lVar12 = 0; lVar12 != 0xe8; lVar12 = lVar12 + 8) {
          uVar1 = *(ushort *)((long)&fake_modes[0].w + lVar12);
          if (((uVar1 < uVar19) ||
              ((uVar1 <= uVar19 && (*(ushort *)((long)&fake_modes[0].h + lVar12) < (ushort)local_58)
               ))) && (iVar4 = AddVidModeToList(local_90,(SDL12_Rect *)
                                                         ((long)&fake_modes[0].x + lVar12),maxw,maxh
                                               ), iVar4 != 0)) {
            iVar4 = (*SDL20_Error)(SDL_ENOMEM);
            pcVar10 = local_60;
            goto LAB_00107615;
          }
        }
      }
      pcVar10 = local_60;
      iVar4 = 0;
      pVVar13 = VideoModes;
LAB_0010759b:
      if (iVar4 < VideoModesCount) {
        uVar7 = pVVar13->nummodes;
        ppSVar14 = (SDL12_Rect **)(*SDL20_calloc)(8,(long)(int)uVar7 + 1);
        pVVar13->modes12 = ppSVar14;
        if (ppSVar14 != (SDL12_Rect **)0x0) goto code_r0x001075be;
        iVar4 = (*SDL20_Error)(SDL_ENOMEM);
LAB_00107615:
        if (iVar4 < 0) {
          return -1;
        }
      }
      else {
        QueuedDisplayOverlays.next = (QueuedOverlayItem *)0x0;
        QueuedDisplayOverlaysTail = &QueuedDisplayOverlays;
      }
    }
    (*SDL20_StopTextInput)();
    iVar17 = (*SDL20_GetDesktopDisplayMode)(VideoDisplayIndex,&mode);
    p_Var2 = SDL20_AllocFormat;
    iVar4 = 0;
    if (iVar17 == 0) {
      SVar9 = mode.format;
      if (uVar3 < (mode.format >> 8 & 0xff)) {
        SVar9 = BPPToPixelFormat(uVar3);
      }
      VideoInfoVfmt20 = (*p_Var2)(SVar9);
      PixelFormat20to12(&VideoInfoVfmt12,&VideoInfoPalette12,VideoInfoVfmt20);
      VideoInfo12.vfmt = &VideoInfoVfmt12;
      VideoInfo12.current_w._2_2_ = mode.w._2_2_;
      VideoInfo12.current_w._0_2_ = (ushort)mode.w;
      VideoInfo12.current_h._0_2_ = (ushort)mode.h;
      VideoInfo12.current_h._2_2_ = mode.h._2_2_;
      uVar3 = 0;
      lVar12 = 0;
      do {
        if (lVar12 == 8) goto LAB_001076c4;
        iVar4 = (*SDL20_strcasecmp)(pcVar10,(char *)((long)&HasWmAvailable_gui_targets_rel +
                                                    (long)*(int *)((long)&
                                                  HasWmAvailable_gui_targets_rel + lVar12)));
        lVar12 = lVar12 + 4;
      } while (iVar4 != 0);
      uVar3 = 2;
LAB_001076c4:
      VideoInfo12._0_4_ = VideoInfo12._0_4_ & 0xfffffffd | uVar3;
      VideoInfo12.video_mem = 0x40000;
      iVar4 = 0;
    }
  }
  return iVar4;
code_r0x001075be:
  uVar18 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar18 = 0;
  }
  for (lVar12 = 0; uVar18 * 8 != lVar12; lVar12 = lVar12 + 8) {
    *(long *)((long)pVVar13->modes12 + lVar12) = (long)&pVVar13->modeslist12->x + lVar12;
  }
  iVar4 = iVar4 + 1;
  pVVar13 = pVVar13 + 1;
  goto LAB_0010759b;
}

Assistant:

static int
Init12Video(void)
{
    const char *driver = SDL20_GetCurrentVideoDriver();
    const char *scale_method_env = SDL12Compat_GetHint("SDL12COMPAT_SCALE_METHOD");
    const unsigned max_bpp = SDL12Compat_GetHintInt("SDL12COMPAT_MAX_BPP", 32);
    SDL_DisplayMode mode;
    int i;

    AllowThreadedDraws = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_DRAWS", SDL_TRUE);
    AllowThreadedPumps = SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_THREADED_PUMPS", SDL_TRUE);

    WantScaleMethodNearest = (scale_method_env && !SDL20_strcmp(scale_method_env, "nearest")) ? SDL_TRUE : SDL_FALSE;

    /* Only override this if the env var is set, as the default is platform-specific. */
    TranslateKeyboardLayout = SDL12Compat_GetHintBoolean("SDL12COMPAT_USE_KEYBOARD_LAYOUT", TranslateKeyboardLayout);

    IsDummyVideo = ((driver != NULL) && (SDL20_strcmp(driver, "dummy") == 0)) ? SDL_TRUE : SDL_FALSE;

    EventQueueMutex = SDL20_CreateMutex();
    if (EventQueueMutex == NULL) {
        return -1;
    }

    for (i = 0; i < SDL12_MAXEVENTS-1; i++) {
        EventQueuePool[i].next = &EventQueuePool[i+1];
    }
    EventQueuePool[SDL12_MAXEVENTS-1].next = NULL;

    EventQueueHead = EventQueueTail = NULL;
    EventQueueAvailable = EventQueuePool;

    SDL20_memset(&PendingKeydownEvent, 0, sizeof(SDL12_Event));

    SDL20_memset(EventStates, SDL_ENABLE, sizeof (EventStates)); /* on by default */

    EventStates[SDL12_SYSWMEVENT] = SDL_IGNORE;  /* off by default. */
    SDL20_EventState(SDL_SYSWMEVENT, SDL_IGNORE);

#if defined(SDL_VIDEO_DRIVER_WINDOWS)
    SupportSysWM = (SDL20_strcmp(driver, "windows") == 0) ? SDL_TRUE : SDL_FALSE;
#elif defined(SDL_VIDEO_DRIVER_X11)
    SupportSysWM = (SDL20_strcmp(driver, "x11") == 0) ? SDL_TRUE : SDL_FALSE;
#else
    SupportSysWM = SDL_FALSE;
#endif

    if (!SDL12Compat_GetHintBoolean("SDL12COMPAT_ALLOW_SYSWM", SDL_TRUE)) {
        SupportSysWM = SDL_FALSE;
    }

    SDL_EnableKeyRepeat(0, 0);

    SDL20_DelEventWatch(EventFilter20to12, NULL);
    SDL20_AddEventWatch(EventFilter20to12, NULL);

    VideoDisplayIndex = GetVideoDisplay();
    SwapInterval = 0;

    VideoWindowGrabbed = SDL_FALSE;
    VideoCursorHidden = SDL_FALSE;
    SDL20_ShowCursor(1);

    if (Init12VidModes() < 0) {
        return -1;
    }

    SDL20_StopTextInput();

    if (SDL20_GetDesktopDisplayMode(VideoDisplayIndex, &mode) == 0) {
        if (SDL_BITSPERPIXEL(mode.format) > max_bpp) {
            VideoInfoVfmt20 = SDL20_AllocFormat(BPPToPixelFormat(max_bpp));
        } else {
            VideoInfoVfmt20 = SDL20_AllocFormat(mode.format);
        }
        VideoInfo12.vfmt = PixelFormat20to12(&VideoInfoVfmt12, &VideoInfoPalette12, VideoInfoVfmt20);
        VideoInfo12.current_w = mode.w;
        VideoInfo12.current_h = mode.h;
        VideoInfo12.wm_available = HasWmAvailable(driver);
        VideoInfo12.video_mem = 1024 * 256;  /* good enough. */
    }

    return 0;
}